

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_negate_unchecked(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  int in_EDX;
  secp256k1_fe *in_RSI;
  long in_RDI;
  uint in_stack_ffffffffffffffe8;
  uint uVar1;
  
  secp256k1_fe_verify(in_RSI);
  uVar1 = in_stack_ffffffffffffffe8 & 0xffffff;
  if (-1 < in_EDX) {
    uVar1 = CONCAT13(in_EDX < 0x20,(int3)in_stack_ffffffffffffffe8);
  }
  if ((((byte)(uVar1 >> 0x18) ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,299,"test condition failed: m >= 0 && m <= 31");
    abort();
  }
  secp256k1_fe_verify_magnitude(in_RSI,in_EDX);
  secp256k1_fe_impl_negate_unchecked(in_RSI,(secp256k1_fe *)CONCAT44(in_EDX,uVar1),0);
  *(int *)(in_RDI + 0x28) = in_EDX + 1;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_negate_unchecked(secp256k1_fe *r, const secp256k1_fe *a, int m) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(m >= 0 && m <= 31);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, m);

    secp256k1_fe_impl_negate_unchecked(r, a, m);
    r->magnitude = m + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}